

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O1

bool __thiscall FIX::message_order::operator()(message_order *this,int x,int y)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = *(int *)this;
  if (iVar1 == 3) {
    iVar1 = *(int *)(this + 0x18);
    if (iVar1 < y || iVar1 < x) {
      return x <= iVar1 || x < y && iVar1 < y;
    }
    iVar1 = *(int *)(*(long *)(this + 0x10) + 0xc + (long)x * 4);
    iVar2 = *(int *)(*(long *)(this + 0x10) + 0xc + (long)y * 4);
    if (iVar1 != 0 || iVar2 != 0) {
      if (iVar1 != 0) {
        return iVar1 < iVar2 || iVar2 == 0;
      }
      return false;
    }
  }
  else {
    if (iVar1 == 1) {
      bVar3 = trailer_order::compare(x,y);
      return bVar3;
    }
    if (iVar1 == 0) {
      bVar3 = header_order::compare(x,y);
      return bVar3;
    }
  }
  return x < y;
}

Assistant:

bool operator()(const int x, const int y) const {
    switch (m_mode) {
    case header:
      return header_order::compare(x, y);
    case trailer:
      return trailer_order::compare(x, y);
    case group:
      return group_order::compare(x, y, m_groupOrder, m_largest);
    case normal:
    default:
      return x < y;
    }
  }